

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void runtime(void)

{
  ostream *poVar1;
  OutputImage<cert::Color,_120UL,_120UL> local_aad4;
  ostream local_208 [8];
  ofstream ppm;
  
  std::ofstream::ofstream(local_208,"output_runtime.ppm",0x10);
  poVar1 = std::operator<<(local_208,"P3\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::operator<<(poVar1,"\n255\n");
  cert::raytrace<120ul,120ul,120ul,120ul,0ul,0ul,3ul>();
  print_image<cert::OutputImage<cert::Color,120ul,120ul>>((ofstream *)local_208,&local_aad4);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void runtime ()
{
	std::ofstream ppm ("output_runtime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, cert::raytrace<width, height, width, height, 0, 0, samples> ());
}